

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

MakeNet * __thiscall notch::core::MakeNet::addFC(MakeNet *this,size_t n,Activation *af)

{
  logic_error *this_00;
  LayerType local_54;
  MakeLayer mk;
  
  checkConfig(this);
  if (n != 0) {
    mk.nInputs = this->nOutputs;
    mk.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    mk.maybeWeights.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    mk.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    mk.maybeBias.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    mk.nOutputs = n;
    mk.maybeActivation = af;
    std::vector<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>::push_back
              (&this->layerMakers,&mk);
    local_54 = FC;
    std::vector<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>::
    emplace_back<notch::core::MakeNet::LayerType>(&this->layerTypes,&local_54);
    this->nOutputs = n;
    MakeLayer::~MakeLayer(&mk);
    return this;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  ::std::logic_error::logic_error(this_00,"cannot add a layer with zero outputs");
  __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
}

Assistant:

MakeNet &addFC(size_t n, const Activation &af = scaledTanh) {
        checkConfig();
        if (!n) {
            throw std::logic_error("cannot add a layer with zero outputs");
        }
        MakeLayer mk(nOutputs, n, af);
        layerMakers.push_back(mk);
        layerTypes.push_back(LayerType::FC);
        nOutputs = n;
        return *this;
    }